

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_pri_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  long local_498;
  REF_INT local_488;
  long local_480;
  long local_460;
  long local_430;
  REF_INT local_420;
  long local_418;
  long local_3f8;
  long local_3c8;
  REF_INT local_3b8;
  long local_3b0;
  long local_390;
  long local_360;
  REF_INT local_350;
  long local_348;
  long local_328;
  long local_2f8;
  REF_INT local_2e8;
  long local_2e0;
  long local_2c0;
  long local_290;
  REF_INT local_280;
  long local_278;
  long local_258;
  int local_234;
  int local_208;
  int local_1dc;
  int local_1b0;
  int local_184;
  int local_158;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nnodesg;
  REF_INT cell;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x25a
           ,"ref_fixture_pri_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  pRVar1->twod = 0;
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 5) / ref_mpi->n) < 6 - ref_mpi->n * (5 / ref_mpi->n)) {
    local_158 = 0 / ((ref_mpi->n + 5) / ref_mpi->n);
  }
  else {
    local_158 = -((6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                (5 / ref_mpi->n) + (6 - ref_mpi->n * (5 / ref_mpi->n));
  }
  if (ref_mpi->id != local_158) {
    if (1 / ((ref_mpi->n + 5) / ref_mpi->n) < 6 - ref_mpi->n * (5 / ref_mpi->n)) {
      local_184 = 1 / ((ref_mpi->n + 5) / ref_mpi->n);
    }
    else {
      local_184 = (1 - (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                  (5 / ref_mpi->n) + (6 - ref_mpi->n * (5 / ref_mpi->n));
    }
    if (ref_mpi->id != local_184) {
      if (2 / ((ref_mpi->n + 5) / ref_mpi->n) < 6 - ref_mpi->n * (5 / ref_mpi->n)) {
        local_1b0 = 2 / ((ref_mpi->n + 5) / ref_mpi->n);
      }
      else {
        local_1b0 = (2 - (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                    (5 / ref_mpi->n) + (6 - ref_mpi->n * (5 / ref_mpi->n));
      }
      if (ref_mpi->id != local_1b0) {
        if (3 / ((ref_mpi->n + 5) / ref_mpi->n) < 6 - ref_mpi->n * (5 / ref_mpi->n)) {
          local_1dc = 3 / ((ref_mpi->n + 5) / ref_mpi->n);
        }
        else {
          local_1dc = (3 - (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                      (5 / ref_mpi->n) + (6 - ref_mpi->n * (5 / ref_mpi->n));
        }
        if (ref_mpi->id != local_1dc) {
          if (4 / ((ref_mpi->n + 5) / ref_mpi->n) < 6 - ref_mpi->n * (5 / ref_mpi->n)) {
            local_208 = 4 / ((ref_mpi->n + 5) / ref_mpi->n);
          }
          else {
            local_208 = (4 - (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n))
                        / (5 / ref_mpi->n) + (6 - ref_mpi->n * (5 / ref_mpi->n));
          }
          if (ref_mpi->id != local_208) {
            if (5 / ((ref_mpi->n + 5) / ref_mpi->n) < 6 - ref_mpi->n * (5 / ref_mpi->n)) {
              local_234 = 5 / ((ref_mpi->n + 5) / ref_mpi->n);
            }
            else {
              local_234 = (5 - (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)
                          ) / (5 / ref_mpi->n) + (6 - ref_mpi->n * (5 / ref_mpi->n));
            }
            if (ref_mpi->id != local_234) goto LAB_00138e4c;
          }
        }
      }
    }
  }
  uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x272
           ,"ref_fixture_pri_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[nnodesg * 0xf] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
  if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
    local_258 = -1;
  }
  else {
    local_258 = ref_node_00->global[nnodesg];
  }
  if (local_258 / (long)((ref_mpi->n + 5) / ref_mpi->n) < (long)(6 - ref_mpi->n * (5 / ref_mpi->n)))
  {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_278 = -1;
    }
    else {
      local_278 = ref_node_00->global[nnodesg];
    }
    local_280 = (REF_INT)(local_278 / (long)((ref_mpi->n + 5) / ref_mpi->n));
  }
  else {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_290 = -1;
    }
    else {
      local_290 = ref_node_00->global[nnodesg];
    }
    local_280 = (int)((local_290 -
                      (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                     (long)(5 / ref_mpi->n)) + (6 - ref_mpi->n * (5 / ref_mpi->n));
  }
  ref_node_00->part[nnodesg] = local_280;
  uVar2 = ref_node_add(ref_node_00,1,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x273
           ,"ref_fixture_pri_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[cell * 0xf] = 0.0;
  ref_node_00->real[cell * 0xf + 1] = 0.0;
  ref_node_00->real[cell * 0xf + 2] = 1.0;
  if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
    local_2c0 = -1;
  }
  else {
    local_2c0 = ref_node_00->global[cell];
  }
  if (local_2c0 / (long)((ref_mpi->n + 5) / ref_mpi->n) < (long)(6 - ref_mpi->n * (5 / ref_mpi->n)))
  {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_2e0 = -1;
    }
    else {
      local_2e0 = ref_node_00->global[cell];
    }
    local_2e8 = (REF_INT)(local_2e0 / (long)((ref_mpi->n + 5) / ref_mpi->n));
  }
  else {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_2f8 = -1;
    }
    else {
      local_2f8 = ref_node_00->global[cell];
    }
    local_2e8 = (int)((local_2f8 -
                      (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                     (long)(5 / ref_mpi->n)) + (6 - ref_mpi->n * (5 / ref_mpi->n));
  }
  ref_node_00->part[cell] = local_2e8;
  uVar2 = ref_node_add(ref_node_00,2,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x274
           ,"ref_fixture_pri_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[0] * 0xf] = 1.0;
  ref_node_00->real[local[0] * 0xf + 1] = 0.0;
  ref_node_00->real[local[0] * 0xf + 2] = 0.0;
  if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
    local_328 = -1;
  }
  else {
    local_328 = ref_node_00->global[local[0]];
  }
  if (local_328 / (long)((ref_mpi->n + 5) / ref_mpi->n) < (long)(6 - ref_mpi->n * (5 / ref_mpi->n)))
  {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_348 = -1;
    }
    else {
      local_348 = ref_node_00->global[local[0]];
    }
    local_350 = (REF_INT)(local_348 / (long)((ref_mpi->n + 5) / ref_mpi->n));
  }
  else {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_360 = -1;
    }
    else {
      local_360 = ref_node_00->global[local[0]];
    }
    local_350 = (int)((local_360 -
                      (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                     (long)(5 / ref_mpi->n)) + (6 - ref_mpi->n * (5 / ref_mpi->n));
  }
  ref_node_00->part[local[0]] = local_350;
  uVar2 = ref_node_add(ref_node_00,3,local + 1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x275
           ,"ref_fixture_pri_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[1] * 0xf] = 0.0;
  ref_node_00->real[local[1] * 0xf + 1] = 1.0;
  ref_node_00->real[local[1] * 0xf + 2] = 0.0;
  if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
    local_390 = -1;
  }
  else {
    local_390 = ref_node_00->global[local[1]];
  }
  if (local_390 / (long)((ref_mpi->n + 5) / ref_mpi->n) < (long)(6 - ref_mpi->n * (5 / ref_mpi->n)))
  {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_3b0 = -1;
    }
    else {
      local_3b0 = ref_node_00->global[local[1]];
    }
    local_3b8 = (REF_INT)(local_3b0 / (long)((ref_mpi->n + 5) / ref_mpi->n));
  }
  else {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_3c8 = -1;
    }
    else {
      local_3c8 = ref_node_00->global[local[1]];
    }
    local_3b8 = (int)((local_3c8 -
                      (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                     (long)(5 / ref_mpi->n)) + (6 - ref_mpi->n * (5 / ref_mpi->n));
  }
  ref_node_00->part[local[1]] = local_3b8;
  uVar2 = ref_node_add(ref_node_00,4,local + 2);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x276
           ,"ref_fixture_pri_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[2] * 0xf] = 0.0;
  ref_node_00->real[local[2] * 0xf + 1] = 1.0;
  ref_node_00->real[local[2] * 0xf + 2] = 1.0;
  if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
    local_3f8 = -1;
  }
  else {
    local_3f8 = ref_node_00->global[local[2]];
  }
  if (local_3f8 / (long)((ref_mpi->n + 5) / ref_mpi->n) < (long)(6 - ref_mpi->n * (5 / ref_mpi->n)))
  {
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_418 = -1;
    }
    else {
      local_418 = ref_node_00->global[local[2]];
    }
    local_420 = (REF_INT)(local_418 / (long)((ref_mpi->n + 5) / ref_mpi->n));
  }
  else {
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_430 = -1;
    }
    else {
      local_430 = ref_node_00->global[local[2]];
    }
    local_420 = (int)((local_430 -
                      (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                     (long)(5 / ref_mpi->n)) + (6 - ref_mpi->n * (5 / ref_mpi->n));
  }
  ref_node_00->part[local[2]] = local_420;
  uVar2 = ref_node_add(ref_node_00,5,local + 3);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x277
           ,"ref_fixture_pri_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[3] * 0xf] = 1.0;
  ref_node_00->real[local[3] * 0xf + 1] = 1.0;
  ref_node_00->real[local[3] * 0xf + 2] = 0.0;
  if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
    local_460 = -1;
  }
  else {
    local_460 = ref_node_00->global[local[3]];
  }
  if (local_460 / (long)((ref_mpi->n + 5) / ref_mpi->n) < (long)(6 - ref_mpi->n * (5 / ref_mpi->n)))
  {
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_480 = -1;
    }
    else {
      local_480 = ref_node_00->global[local[3]];
    }
    local_488 = (REF_INT)(local_480 / (long)((ref_mpi->n + 5) / ref_mpi->n));
  }
  else {
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_498 = -1;
    }
    else {
      local_498 = ref_node_00->global[local[3]];
    }
    local_488 = (int)((local_498 -
                      (6 - ref_mpi->n * (5 / ref_mpi->n)) * ((ref_mpi->n + 5) / ref_mpi->n)) /
                     (long)(5 / ref_mpi->n)) + (6 - ref_mpi->n * (5 / ref_mpi->n));
  }
  ref_node_00->part[local[3]] = local_488;
  uVar2 = ref_cell_add(pRVar1->cell[10],&nnodesg,&ref_private_macro_code_rss);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x279
           ,"ref_fixture_pri_grid",(ulong)uVar2,"add prism");
    return uVar2;
  }
LAB_00138e4c:
  ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,6);
  if (ref_grid_ptr_local._4_4_ == 0) {
    ref_grid_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x27c
           ,"ref_fixture_pri_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 6;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_FALSE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 0.0, 1.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);
    add_that_node(4, 0.0, 1.0, 1.0);
    add_that_node(5, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}